

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O3

CharFormat testing::internal::PrintAsStringLiteralTo(wchar_t c,ostream *os)

{
  CharFormat CVar1;
  
  if (c == L'\"') {
    std::__ostream_insert<char,std::char_traits<char>>(os,"\\\"",2);
    CVar1 = kSpecialEscape;
  }
  else {
    if (c != L'\'') {
      CVar1 = PrintAsCharLiteralTo<wchar_t,wchar_t>(c,os);
      return CVar1;
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"\'",1);
    CVar1 = kAsIs;
  }
  return CVar1;
}

Assistant:

static CharFormat PrintAsStringLiteralTo(wchar_t c, ostream* os) {
  switch (c) {
    case L'\'':
      *os << "'";
      return kAsIs;
    case L'"':
      *os << "\\\"";
      return kSpecialEscape;
    default:
      return PrintAsCharLiteralTo<wchar_t>(c, os);
  }
}